

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_test_connection.c
# Opt level: O0

void send_packet(apx_clientSocketConnection_t *self)

{
  uint8_t *msgData;
  uint8_t *data;
  apx_clientSocketConnection_t *self_local;
  
  if ((self->socket_object != (msocket_t *)0x0) && (self->pending_bytes != 0)) {
    msgData = adt_bytearray_const_data(&self->send_buffer);
    msocket_send(self->socket_object,msgData,self->pending_bytes);
    adt_bytearray_clear(&self->send_buffer);
    self->pending_bytes = 0;
  }
  return;
}

Assistant:

static void send_packet(apx_clientTestConnection_t* self)
{
   adt_bytearray_t* packet = adt_bytearray_new(0u);
   if (packet != NULL)
   {
      adt_error_t result = adt_bytearray_resize(packet, (uint32_t) self->pending_bytes);
      if (result == ADT_NO_ERROR)
      {
         memcpy(adt_bytearray_data(packet), adt_bytearray_data(&self->transmit_buffer), self->pending_bytes);
         adt_ary_push(self->transmit_log, packet);
      }
   }
   adt_bytearray_clear(&self->transmit_buffer);
   self->pending_bytes = 0u;
}